

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  long *plVar1;
  atomic<long> *paVar2;
  long lVar3;
  value_type vVar4;
  byte key_byte;
  key_prefix_snapshot kVar5;
  ulong uVar6;
  undefined1 uVar7;
  bool bVar8;
  value_type vVar9;
  uint uVar10;
  int iVar11;
  node_ptr nVar12;
  stack_entry *psVar13;
  void *pvVar14;
  void *__n;
  undefined7 in_register_00000081;
  olc_node_ptr aleaf;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *this_00;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar15;
  node_type nVar16;
  byte bVar17;
  find_result fVar18;
  undefined1 local_f0 [8];
  iter_result_opt cnxt;
  undefined1 local_b8 [8];
  iter_result_opt nxt;
  key_prefix_snapshot local_88;
  key_prefix_snapshot key_prefix;
  undefined4 local_74;
  undefined1 local_70 [8];
  read_critical_section c_critical_section;
  undefined1 auStack_58 [8];
  read_critical_section node_critical_section;
  read_critical_section parent_critical_section;
  
  pvVar14 = search_key.field_0._8_8_;
  local_74 = (undefined4)CONCAT71(in_register_00000081,fwd);
  invalidate(this);
  *match = false;
  cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._24_8_ =
       match;
  optimistic_lock::try_read_lock((optimistic_lock *)&node_critical_section.version);
  if (node_critical_section.version.version != 0) {
    aleaf.tagged_ptr = (this->db_->root).value._M_i.tagged_ptr;
    if (aleaf.tagged_ptr == 0) {
      if (*(long *)(node_critical_section.version.version + 8) < 1) {
LAB_00133992:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      bVar17 = parent_critical_section.lock ==
               *(optimistic_lock **)node_critical_section.version.version;
      if ((bool)bVar17) {
        LOCK();
        plVar1 = (long *)(node_critical_section.version.version + 8);
        lVar3 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (SBORROW8(lVar3,1) != *plVar1 < 0) {
LAB_001339b1:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      else {
        optimistic_lock::dec_read_lock_count
                  ((optimistic_lock *)node_critical_section.version.version);
      }
      node_critical_section.version.version = 0;
      goto LAB_00133942;
    }
    bVar8 = optimistic_lock::read_critical_section::check
                      ((read_critical_section *)&node_critical_section.version);
    if (bVar8) {
      parent_critical_section.version.version._4_4_ = search_key.field_0._8_4_;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _24_8_ = search_key.field_0._0_8_;
      key_prefix = (key_prefix_snapshot)this;
LAB_0013313a:
      if (aleaf.tagged_ptr == 0) {
        __assert_fail("node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x90a,
                      "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      this_00 = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                 *)(aleaf.tagged_ptr & 0xfffffffffffffff8);
      optimistic_lock::try_read_lock((optimistic_lock *)auStack_58);
      if ((auStack_58 != (undefined1  [8])0x0) &&
         (bVar8 = optimistic_lock::read_critical_section::check
                            ((read_critical_section *)&node_critical_section.version),
         kVar5 = key_prefix, bVar8)) {
        nVar16 = (node_type)aleaf.tagged_ptr & (I256|I48);
        if ((aleaf.tagged_ptr & 7) != 0) {
          kVar5 = (key_prefix_snapshot)*(key_prefix_snapshot *)&this_00->key_size;
          local_b8 = (undefined1  [8])0x0;
          __n = pvVar14;
          if ((void *)0x7 < pvVar14) {
            __n = (void *)0x8;
          }
          local_88 = kVar5;
          memcpy(local_b8,(void *)nxt.
                                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                  ._24_8_,(size_t)__n);
          uVar10 = detail::key_prefix_snapshot::get_shared_length
                             ((key_prefix_snapshot *)&local_88.f,(uint64_t)local_b8);
          if (uVar10 < kVar5.f.key_prefix_length) {
            vVar4 = *(value_type *)
                     (nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._24_8_ + (ulong)uVar10);
            vVar9 = detail::key_prefix_snapshot::operator[]
                              ((key_prefix_snapshot *)&local_88.f,(ulong)uVar10);
            kVar5 = key_prefix;
            if (vVar4 == vVar9) {
              __assert_fail("cmp_ != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x93b,
                            "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                           );
            }
            if ((char)local_74 == '\0') {
              if (vVar9 <= vVar4) {
                bVar8 = try_right_most_traversal
                                  ((iterator *)key_prefix,aleaf,
                                   (read_critical_section *)&node_critical_section.version);
                goto LAB_001334c7;
              }
              bVar8 = try_left_most_traversal
                                ((iterator *)key_prefix,aleaf,
                                 (read_critical_section *)&node_critical_section.version);
              bVar8 = unlock_and_return((read_critical_section *)auStack_58,bVar8);
              if (bVar8) {
                bVar8 = try_prior((iterator *)kVar5);
                parent_critical_section.version.version._4_4_ = (uint)bVar8;
                goto LAB_001334d6;
              }
            }
            else {
              if (vVar4 < vVar9) {
                bVar8 = try_left_most_traversal
                                  ((iterator *)key_prefix,aleaf,
                                   (read_critical_section *)&node_critical_section.version);
LAB_001334c7:
                bVar8 = unlock_and_return((read_critical_section *)auStack_58,bVar8);
                parent_critical_section.version.version._4_4_ = (uint)bVar8;
                goto LAB_001334d6;
              }
              bVar8 = try_right_most_traversal
                                ((iterator *)key_prefix,aleaf,
                                 (read_critical_section *)&node_critical_section.version);
              bVar8 = unlock_and_return((read_critical_section *)auStack_58,bVar8);
              if (bVar8) {
                bVar8 = try_next((iterator *)kVar5);
                parent_critical_section.version.version._4_4_ = (uint)bVar8;
                goto LAB_001334d6;
              }
            }
            goto LAB_001338e7;
          }
          c_critical_section.version.version = aleaf.tagged_ptr;
          detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::shift_right
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     &nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_engaged,kVar5.u64 >> 0x38);
          key_byte = *(byte *)nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                              ._24_8_;
          fVar18 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)this_00,nVar16,key_byte);
          kVar5 = key_prefix;
          if (fVar18.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) {
            if ((char)local_74 == '\0') {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::lte_key_byte((iter_result_opt *)local_b8,
                             (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                              *)this_00,nVar16,key_byte);
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
              uVar7 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00133992;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) {
LAB_00133907:
                  aleaf.tagged_ptr = c_critical_section.version.version;
                  optimistic_lock::dec_read_lock_count
                            ((optimistic_lock *)node_critical_section.version.version);
                  node_critical_section.version.version = 0;
                  goto LAB_00133933;
                }
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) == *plVar1 < 0) {
                  node_critical_section.version.version = 0;
                  if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1
                     ) goto LAB_00133992;
                  if (node_critical_section.lock != *(optimistic_lock **)auStack_58)
                  goto LAB_00133929;
                  LOCK();
                  paVar2 = (atomic<long> *)((long)auStack_58 + 8);
                  lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                  (paVar2->super___atomic_base<long>)._M_i =
                       (paVar2->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
                    auStack_58 = (undefined1  [8])0x0;
                    if (*(long *)(kVar5.u64 + 0x38) != *(long *)(kVar5.u64 + 0x18)) {
                      pop((iterator *)kVar5);
                    }
                    do {
                      if (*(long *)(kVar5.u64 + 0x38) == *(long *)(kVar5.u64 + 0x18))
                      goto LAB_00133484;
                      psVar13 = top((iterator *)kVar5);
                      uVar6 = (psVar13->super_iter_result).node.tagged_ptr;
                      pbVar15 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)(uVar6 & 0xfffffffffffffff8);
                      c_critical_section.lock = (optimistic_lock *)psVar13->version;
                      LOCK();
                      paVar2 = &(pbVar15->super_header_type).m_lock.read_lock_count;
                      (paVar2->super___atomic_base<long>)._M_i =
                           (paVar2->super___atomic_base<long>)._M_i + 1;
                      UNLOCK();
                      local_70 = (undefined1  [8])pbVar15;
                      bVar8 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)local_70);
                      if (bVar8) {
                        nVar16 = (node_type)uVar6;
                        detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::prior((iter_result_opt *)local_f0,pbVar15,nVar16 & (I256|I48),
                                (psVar13->super_iter_result).child_index);
                        if (cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._M_payload._16_1_ == '\x01') {
                          nVar12 = detail::
                                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   ::get_child(pbVar15,nVar16 & (I256|I48),
                                               (psVar13->super_iter_result).child_index);
                          bVar8 = optimistic_lock::read_critical_section::check
                                            ((read_critical_section *)local_70);
                          if (bVar8) {
                            bVar8 = try_right_most_traversal
                                              ((iterator *)kVar5,(olc_node_ptr)nVar12.tagged_ptr,
                                               (read_critical_section *)local_70);
                            parent_critical_section.version.version._4_4_ = (uint)bVar8;
                            bVar8 = false;
                          }
                          else {
                            bVar8 = false;
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                        }
                        else {
                          pop((iterator *)kVar5);
                          if ((((header_type *)local_70)->m_lock).read_lock_count.
                              super___atomic_base<long>._M_i < 1) goto LAB_00133992;
                          bVar8 = c_critical_section.lock ==
                                  (optimistic_lock *)
                                  (((header_type *)local_70)->m_lock).version.version.
                                  super___atomic_base<unsigned_long>._M_i;
                          if (bVar8) {
                            LOCK();
                            paVar2 = &(((header_type *)local_70)->m_lock).read_lock_count;
                            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar3,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_001339b1;
                          }
                          else {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)local_70);
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                          local_70 = (undefined1  [8])0x0;
                        }
                      }
                      else {
                        bVar8 = false;
                        parent_critical_section.version.version._4_4_ = 0;
                      }
                      optimistic_lock::read_critical_section::~read_critical_section
                                ((read_critical_section *)local_70);
                    } while (bVar8);
                    goto LAB_001334d6;
                  }
                }
                goto LAB_001339b1;
              }
              nVar12 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_00,nVar16,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar8 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (bVar8) {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00133992;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) goto LAB_00133913;
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_001339b1;
                node_critical_section.version.version = 0;
                bVar8 = try_push((iterator *)kVar5,(olc_node_ptr)c_critical_section.version.version,
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._M_value.node.tagged_ptr._0_1_,uVar7,
                                 (key_prefix_snapshot)
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._8_8_,(read_critical_section *)auStack_58);
                if (bVar8) {
                  bVar8 = try_right_most_traversal
                                    ((iterator *)kVar5,(olc_node_ptr)nVar12.tagged_ptr,
                                     (read_critical_section *)auStack_58);
                  parent_critical_section.version.version._4_4_ = (uint)bVar8;
                  aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
                  goto LAB_001334d6;
                }
              }
            }
            else {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::gte_key_byte((iter_result_opt *)local_b8,
                             (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                              *)this_00,nVar16,key_byte);
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
              uVar7 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00133992;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) goto LAB_00133907;
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) == *plVar1 < 0) {
                  node_critical_section.version.version = 0;
                  if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1
                     ) goto LAB_00133992;
                  if (node_critical_section.lock != *(optimistic_lock **)auStack_58) {
LAB_00133929:
                    aleaf.tagged_ptr = c_critical_section.version.version;
                    node_critical_section.version.version = 0;
                    optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_58);
                    auStack_58 = (undefined1  [8])0x0;
LAB_00133933:
                    parent_critical_section.version.version._4_4_ = 0;
                    goto LAB_001334d6;
                  }
                  LOCK();
                  paVar2 = (atomic<long> *)((long)auStack_58 + 8);
                  lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                  (paVar2->super___atomic_base<long>)._M_i =
                       (paVar2->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
                    auStack_58 = (undefined1  [8])0x0;
                    if (*(long *)(kVar5.u64 + 0x38) != *(long *)(kVar5.u64 + 0x18)) {
                      pop((iterator *)kVar5);
                    }
                    do {
                      if (*(long *)(kVar5.u64 + 0x38) == *(long *)(kVar5.u64 + 0x18))
                      goto LAB_00133484;
                      psVar13 = top((iterator *)kVar5);
                      uVar6 = (psVar13->super_iter_result).node.tagged_ptr;
                      pbVar15 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)(uVar6 & 0xfffffffffffffff8);
                      c_critical_section.lock = (optimistic_lock *)psVar13->version;
                      LOCK();
                      paVar2 = &(pbVar15->super_header_type).m_lock.read_lock_count;
                      (paVar2->super___atomic_base<long>)._M_i =
                           (paVar2->super___atomic_base<long>)._M_i + 1;
                      UNLOCK();
                      local_70 = (undefined1  [8])pbVar15;
                      bVar8 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)local_70);
                      if (bVar8) {
                        nVar16 = (node_type)uVar6;
                        detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::next((iter_result_opt *)local_f0,pbVar15,nVar16 & (I256|I48),
                               (psVar13->super_iter_result).child_index);
                        if (cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._M_payload._16_1_ == '\x01') {
                          nVar12 = detail::
                                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   ::get_child(pbVar15,nVar16 & (I256|I48),
                                               (psVar13->super_iter_result).child_index);
                          bVar8 = optimistic_lock::read_critical_section::check
                                            ((read_critical_section *)local_70);
                          if (bVar8) {
                            bVar8 = try_left_most_traversal
                                              ((iterator *)kVar5,(olc_node_ptr)nVar12.tagged_ptr,
                                               (read_critical_section *)local_70);
                            parent_critical_section.version.version._4_4_ = (uint)bVar8;
                            bVar8 = false;
                          }
                          else {
                            bVar8 = false;
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                        }
                        else {
                          pop((iterator *)kVar5);
                          if ((((header_type *)local_70)->m_lock).read_lock_count.
                              super___atomic_base<long>._M_i < 1) goto LAB_00133992;
                          bVar8 = c_critical_section.lock ==
                                  (optimistic_lock *)
                                  (((header_type *)local_70)->m_lock).version.version.
                                  super___atomic_base<unsigned_long>._M_i;
                          if (bVar8) {
                            LOCK();
                            paVar2 = &(((header_type *)local_70)->m_lock).read_lock_count;
                            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar3,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_001339b1;
                          }
                          else {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)local_70);
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                          local_70 = (undefined1  [8])0x0;
                        }
                      }
                      else {
                        bVar8 = false;
                        parent_critical_section.version.version._4_4_ = 0;
                      }
                      optimistic_lock::read_critical_section::~read_critical_section
                                ((read_critical_section *)local_70);
                    } while (bVar8);
                    goto LAB_001334d6;
                  }
                }
                goto LAB_001339b1;
              }
              nVar12 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_00,nVar16,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar8 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (bVar8) {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00133992;
                if (parent_critical_section.lock ==
                    *(optimistic_lock **)node_critical_section.version.version) {
                  LOCK();
                  plVar1 = (long *)(node_critical_section.version.version + 8);
                  lVar3 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_001339b1;
                  node_critical_section.version.version = 0;
                  bVar8 = try_push((iterator *)kVar5,
                                   (olc_node_ptr)c_critical_section.version.version,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._0_1_,uVar7,
                                   (key_prefix_snapshot)
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._8_8_,(read_critical_section *)auStack_58);
                  if (bVar8) {
                    bVar8 = try_left_most_traversal
                                      ((iterator *)kVar5,(olc_node_ptr)nVar12.tagged_ptr,
                                       (read_critical_section *)auStack_58);
                    parent_critical_section.version.version._4_4_ = (uint)bVar8;
                    aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
                    goto LAB_001334d6;
                  }
                }
                else {
LAB_00133913:
                  optimistic_lock::dec_read_lock_count
                            ((optimistic_lock *)node_critical_section.version.version);
                  node_critical_section.version.version = 0;
                }
              }
            }
            parent_critical_section.version.version._4_4_ = 0;
            aleaf.tagged_ptr = c_critical_section.version.version;
LAB_001334d6:
            bVar8 = false;
          }
          else {
            bVar8 = try_push((iterator *)key_prefix,(olc_node_ptr)c_critical_section.version.version
                             ,key_byte,fVar18.first,local_88,(read_critical_section *)auStack_58);
            if (bVar8) {
              aleaf.tagged_ptr = ((fVar18.second)->value)._M_i.tagged_ptr;
              detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
              shift_right((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                          &nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._M_engaged,1);
              bVar8 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (!bVar8) goto LAB_001338e7;
              node_critical_section.version.version = (version_tag_type)auStack_58;
              parent_critical_section.lock = node_critical_section.lock;
              auStack_58 = (undefined1  [8])0x0;
              bVar8 = true;
            }
            else {
              bVar8 = false;
              parent_critical_section.version.version._4_4_ = 0;
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
            }
          }
          goto LAB_001334d8;
        }
        if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00133992;
        if (parent_critical_section.lock ==
            *(optimistic_lock **)node_critical_section.version.version) {
          LOCK();
          plVar1 = (long *)(node_critical_section.version.version + 8);
          lVar3 = *plVar1;
          *plVar1 = *plVar1 + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_001339b1;
          node_critical_section.version.version = 0;
          bVar8 = try_push_leaf((iterator *)key_prefix,aleaf,(read_critical_section *)auStack_58);
          if (!bVar8) goto LAB_001338e7;
          iVar11 = detail::
                   basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                   ::cmp(this_00,search_key.field_0._0_8_,pvVar14);
          if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_00133992;
          if (node_critical_section.lock == *(optimistic_lock **)auStack_58) {
            LOCK();
            paVar2 = (atomic<long> *)((long)auStack_58 + 8);
            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
            (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
              auStack_58 = (undefined1  [8])0x0;
              if (iVar11 == 0) {
                *(undefined1 *)
                 cnxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                 ._24_8_ = 1;
LAB_00133484:
                parent_critical_section.version.version._4_4_ = 1;
              }
              else if ((char)local_74 == '\0') {
                if (0 < iVar11) goto LAB_00133484;
                bVar8 = try_prior((iterator *)kVar5);
                parent_critical_section.version.version._4_4_ = (uint)bVar8;
              }
              else {
                if (iVar11 < 0) goto LAB_00133484;
                bVar8 = try_next((iterator *)kVar5);
                parent_critical_section.version.version._4_4_ = (uint)bVar8;
              }
              goto LAB_001334d6;
            }
            goto LAB_001339b1;
          }
          optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_58);
          auStack_58 = (undefined1  [8])0x0;
        }
        else {
          optimistic_lock::dec_read_lock_count
                    ((optimistic_lock *)node_critical_section.version.version);
          node_critical_section.version.version = 0;
        }
      }
LAB_001338e7:
      bVar8 = false;
      parent_critical_section.version.version._4_4_ = 0;
LAB_001334d8:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)auStack_58);
      if (!bVar8) goto LAB_0013393f;
      goto LAB_0013313a;
    }
  }
  bVar17 = 0;
  goto LAB_00133942;
LAB_0013393f:
  bVar17 = (byte)parent_critical_section.version.version._4_4_;
LAB_00133942:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&node_critical_section.version);
  return (bool)(bVar17 & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}